

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_example.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference piVar4;
  _Node_iterator_base<int,_false> _Stack_120;
  int element_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1_1;
  key_type local_fc;
  _Node_iterator_base<int,_false> local_f8;
  _Node_iterator_base<int,_false> local_f0;
  _Node_iterator_base<int,_false> local_e8;
  _Node_iterator_base<int,_false> local_e0;
  key_type local_d4;
  _Node_iterator_base<int,_false> local_d0;
  _Node_iterator_base<int,_false> local_c8;
  key_type local_bc;
  _Node_iterator_base<int,_false> local_b8;
  iterator iterator;
  _Node_iterator_base<int,_false> _Stack_a8;
  int element;
  iterator __end1;
  iterator __begin1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1;
  int local_70;
  int i;
  int kArraySize;
  int integers [6];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> my_integers_set;
  char **argv_local;
  int argc_local;
  
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             (integers + 4));
  _i = 0x100000002;
  integers[0] = 3;
  integers[1] = 2;
  integers[2] = 3;
  integers[3] = 1;
  for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               (integers + 4),&i + local_70);
  }
  std::operator<<((ostream *)&std::cout,"Elements of set\n");
  __end1 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                     ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)(integers + 4));
  _Stack_a8._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4));
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<int,_false>,&stack0xffffffffffffff58);
    if (!bVar1) break;
    piVar4 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end1);
    iterator.super__Node_iterator_base<int,_false>._M_cur._4_4_ = *piVar4;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        iterator.super__Node_iterator_base<int,_false>._M_cur._4_4_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Set size: ");
  sVar3 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                    ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )(integers + 4));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_bc = 5;
  local_b8._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4),&local_bc);
  local_c8._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4));
  bVar1 = std::__detail::operator==(&local_b8,&local_c8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element not found in set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element found in set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_d4 = 1;
  local_d0._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4),&local_d4);
  local_b8._M_cur = local_d0._M_cur;
  local_e0._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4));
  bVar1 = std::__detail::operator==(&local_b8,&local_e0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element not found in set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element found in set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_e8._M_cur = local_b8._M_cur;
  local_f0._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::erase
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4),local_b8._M_cur);
  local_fc = 1;
  local_f8._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4),&local_fc);
  local_b8._M_cur = local_f8._M_cur;
  __range1_1 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               end((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   (integers + 4));
  bVar1 = std::__detail::operator==(&local_b8,(_Node_iterator_base<int,_false> *)&__range1_1);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element not found in set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element found in set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"Elements of set\n");
  __end1_1 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   (integers + 4));
  _Stack_120._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  (integers + 4));
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.super__Node_iterator_base<int,_false>,&stack0xfffffffffffffee0);
    if (!bVar1) break;
    piVar4 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end1_1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end1_1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Set size: ");
  sVar3 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                    ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )(integers + 4));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             (integers + 4));
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Declaration of a unordered_set is very similar to a vector.
  std::unordered_set<int> my_integers_set;
  // Let's insert elements into the set from an array.
  int integers[] = {2, 1, 3, 2, 3, 1};
  // A neat trick to get the size of arrays.
  const int kArraySize = sizeof(integers) / sizeof(integers[0]);
  for (int i = 0; i < kArraySize; ++i) {
    my_integers_set.insert(integers[i]);
  }
  // Let's print out the contents of set.
  std::cout << "Elements of set\n";
  for (int element : my_integers_set) {
    std::cout << element << std::endl;
  }
  std::cout << "Set size: " << my_integers_set.size() << std::endl;
  // Sets are useful to search elements. However, it requires knowledge of
  // iterators. See iteratorsexample.cc to see more examples about iterators.
  // Say we want to see if the number 5 is in the set.
  // The set returns an iterator different than std::set::end() when the element
  // is present in the set, and returns std::set::end() otherwise.
  // Let's search for an element not in the set.
  std::unordered_set<int>::iterator iterator = my_integers_set.find(5);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Let's search for an element in the set.
  iterator = my_integers_set.find(1);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Note that the elements are sorted. This is because the set exploits
  // the ordering property to organize the elements and remove duplicates.
  // To erase elements we need to understand what iterators are, see
  // iterators_example.cc for explanation and illustration of iterators.
  // To erase one element from the set, we need to obtain an iterator first to
  // that element and pass the iterator as the element to erase.
  my_integers_set.erase(iterator);
  // Let's verify that it erased the element, in this case will erase 1 since
  // iterator is "pointing" to it.
  iterator = my_integers_set.find(1);
  if (iterator == my_integers_set.end()) {
    std::cout << "Element not found in set" << std::endl;
  } else {
    std::cout << "Element found in set" << std::endl;
  }
  // Let's print out the contents of set.
  std::cout << "Elements of set\n";
  for (int element : my_integers_set) {
    std::cout << element << std::endl;
  }
  std::cout << "Set size: " << my_integers_set.size() << std::endl;
  return 0;
}